

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::EmbeddingNDLayerParams::EmbeddingNDLayerParams
          (EmbeddingNDLayerParams *this,EmbeddingNDLayerParams *from)

{
  void *pvVar1;
  WeightParams *pWVar2;
  uint64 uVar3;
  WeightParams *pWVar4;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__EmbeddingNDLayerParams_003d3950;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pWVar2 = from->weights_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (EmbeddingNDLayerParams *)&_EmbeddingNDLayerParams_default_instance_) {
    pWVar4 = (WeightParams *)0x0;
  }
  else {
    pWVar4 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar4,pWVar2);
  }
  this->weights_ = pWVar4;
  pWVar2 = from->bias_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (EmbeddingNDLayerParams *)&_EmbeddingNDLayerParams_default_instance_) {
    pWVar4 = (WeightParams *)0x0;
  }
  else {
    pWVar4 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar4,pWVar2);
  }
  this->bias_ = pWVar4;
  uVar3 = from->embeddingsize_;
  this->vocabsize_ = from->vocabsize_;
  this->embeddingsize_ = uVar3;
  this->hasbias_ = from->hasbias_;
  return;
}

Assistant:

EmbeddingNDLayerParams::EmbeddingNDLayerParams(const EmbeddingNDLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_weights()) {
    weights_ = new ::CoreML::Specification::WeightParams(*from.weights_);
  } else {
    weights_ = NULL;
  }
  if (from.has_bias()) {
    bias_ = new ::CoreML::Specification::WeightParams(*from.bias_);
  } else {
    bias_ = NULL;
  }
  ::memcpy(&vocabsize_, &from.vocabsize_,
    reinterpret_cast<char*>(&hasbias_) -
    reinterpret_cast<char*>(&vocabsize_) + sizeof(hasbias_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.EmbeddingNDLayerParams)
}